

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

int32_t repTextExtract(UText *ut,int64_t start,int64_t limit,UChar *dest,int32_t destCapacity,
                      UErrorCode *status)

{
  Replaceable *this;
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  UChar32 UVar4;
  int length_00;
  undefined1 local_98 [8];
  UnicodeString buffer;
  uint local_50;
  int32_t limit32;
  int32_t start32;
  int32_t length;
  Replaceable *rep;
  UErrorCode *status_local;
  int32_t destCapacity_local;
  UChar *dest_local;
  int64_t limit_local;
  int64_t start_local;
  UText *ut_local;
  
  this = (Replaceable *)ut->context;
  dest_local = (UChar *)limit;
  limit_local = start;
  start_local = (int64_t)ut;
  iVar3 = icu_63::Replaceable::length(this);
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    if ((destCapacity < 0) || ((dest == (UChar *)0x0 && (0 < destCapacity)))) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    if ((long)dest_local < limit_local) {
      *status = U_INDEX_OUTOFBOUNDS_ERROR;
      ut_local._4_4_ = 0;
    }
    else {
      local_50 = pinIndex(&limit_local,(long)iVar3);
      buffer.fUnion._52_4_ = pinIndex((int64_t *)&dest_local,(long)iVar3);
      if ((int)local_50 < iVar3) {
        cVar2 = icu_63::Replaceable::charAt(this,local_50);
        if ((cVar2 & 0xfc00U) == 0xdc00) {
          UVar4 = icu_63::Replaceable::char32At(this,local_50);
          if (UVar4 - 0x10000U < 0x100000) {
            local_50 = local_50 - 1;
          }
        }
      }
      if ((int)buffer.fUnion._52_4_ < iVar3) {
        cVar2 = icu_63::Replaceable::charAt(this,buffer.fUnion._52_4_);
        if ((cVar2 & 0xfc00U) == 0xdc00) {
          UVar4 = icu_63::Replaceable::char32At(this,buffer.fUnion._52_4_);
          if (UVar4 - 0x10000U < 0x100000) {
            buffer.fUnion._52_4_ = buffer.fUnion._52_4_ + -1;
          }
        }
      }
      length_00 = buffer.fUnion._52_4_ - local_50;
      if (destCapacity < length_00) {
        buffer.fUnion._52_4_ = local_50 + destCapacity;
      }
      icu_63::UnicodeString::UnicodeString((UnicodeString *)local_98,dest,0,destCapacity);
      (*(this->super_UObject)._vptr_UObject[3])
                (this,(ulong)local_50,(ulong)(uint)buffer.fUnion._52_4_,(UnicodeString *)local_98);
      repTextAccess((UText *)start_local,(long)(int)buffer.fUnion._52_4_,'\x01');
      ut_local._4_4_ = u_terminateUChars_63(dest,destCapacity,length_00,status);
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_98);
    }
  }
  else {
    ut_local._4_4_ = 0;
  }
  return ut_local._4_4_;
}

Assistant:

static int32_t U_CALLCONV
repTextExtract(UText *ut,
               int64_t start, int64_t limit,
               UChar *dest, int32_t destCapacity,
               UErrorCode *status) {
    const Replaceable *rep=(const Replaceable *)ut->context;
    int32_t  length=rep->length();

    if(U_FAILURE(*status)) {
        return 0;
    }
    if(destCapacity<0 || (dest==NULL && destCapacity>0)) {
        *status=U_ILLEGAL_ARGUMENT_ERROR;
    }
    if(start>limit) {
        *status=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    int32_t  start32 = pinIndex(start, length);
    int32_t  limit32 = pinIndex(limit, length);

    // adjust start, limit if they point to trail half of surrogates
    if (start32<length && U16_IS_TRAIL(rep->charAt(start32)) &&
        U_IS_SUPPLEMENTARY(rep->char32At(start32))){
            start32--;
    }
    if (limit32<length && U16_IS_TRAIL(rep->charAt(limit32)) &&
        U_IS_SUPPLEMENTARY(rep->char32At(limit32))){
            limit32--;
    }

    length=limit32-start32;
    if(length>destCapacity) {
        limit32 = start32 + destCapacity;
    }
    UnicodeString buffer(dest, 0, destCapacity); // writable alias
    rep->extractBetween(start32, limit32, buffer);
    repTextAccess(ut, limit32, TRUE);

    return u_terminateUChars(dest, destCapacity, length, status);
}